

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionElementType::~IfcDistributionElementType
          (IfcDistributionElementType *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  pointer pcVar4;
  void *pvVar5;
  
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = 0x817c28;
  *(undefined8 *)&(this->super_IfcElementType).field_0x190 = 0x817cf0;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       0x817c50;
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x817c78;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       0x817ca0;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x148 = 0x817cc8;
  puVar3 = *(undefined1 **)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x158;
  puVar1 = &(this->super_IfcElementType).field_0x168;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = 0x817d18;
  *(undefined8 *)&(this->super_IfcElementType).field_0x190 = 0x817db8;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       0x817d40;
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x817d68;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       0x817d90;
  pcVar4 = (this->super_IfcElementType).super_IfcTypeProduct.Tag.ptr._M_dataplus._M_p;
  paVar2 = &(this->super_IfcElementType).super_IfcTypeProduct.Tag.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  pvVar5 = *(void **)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
                      field_0x100;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,*(long *)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x110 -
                           (long)pvVar5);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)this,&PTR_construction_vtable_24__00817af0);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

IfcDistributionElementType() : Object("IfcDistributionElementType") {}